

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anytrans.cpp
# Opt level: O2

Transliterator * __thiscall
icu_63::AnyTransliterator::getTransliterator(AnyTransliterator *this,UScriptCode source)

{
  Transliterator *pTVar1;
  char *src;
  UnicodeString *pUVar2;
  Transliterator *pTVar3;
  UErrorCode ec;
  Mutex m_1;
  ConstChar16Ptr local_b8;
  UChar *local_b0;
  UnicodeString id;
  Mutex m;
  
  if (source == USCRIPT_INVALID_CODE) {
    return (Transliterator *)0x0;
  }
  if (this->targetScript == source) {
    return (Transliterator *)0x0;
  }
  m.fMutex = (UMutex *)0x0;
  umtx_lock_63((UMutex *)0x0);
  pTVar1 = (Transliterator *)uhash_iget_63(this->cache,source);
  Mutex::~Mutex(&m);
  if (pTVar1 != (Transliterator *)0x0) {
    return pTVar1;
  }
  ec = U_ZERO_ERROR;
  src = uscript_getShortName_63(source);
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&m,src,-1,kInvariant);
  icu_63::UnicodeString::UnicodeString(&id,(UnicodeString *)&m);
  pUVar2 = icu_63::UnicodeString::append(&id,L'-');
  icu_63::UnicodeString::append(pUVar2,&this->target);
  pTVar1 = Transliterator::createInstance(&id,UTRANS_FORWARD,&ec);
  if ((pTVar1 == (Transliterator *)0x0) || (U_ZERO_ERROR < ec)) {
    if (pTVar1 != (Transliterator *)0x0) {
      (*(pTVar1->super_UObject)._vptr_UObject[1])(pTVar1);
    }
    icu_63::UnicodeString::operator=(&id,(UnicodeString *)&m);
    local_b8.p_ = L"-Latn;Latn-";
    pUVar2 = icu_63::UnicodeString::append(&id,&local_b8,-1);
    icu_63::UnicodeString::append(pUVar2,&this->target);
    local_b0 = local_b8.p_;
    pTVar1 = Transliterator::createInstance(&id,UTRANS_FORWARD,&ec);
    if (pTVar1 == (Transliterator *)0x0 || ec < U_ILLEGAL_ARGUMENT_ERROR) {
      if (pTVar1 == (Transliterator *)0x0 || U_ZERO_ERROR < ec) {
        pTVar3 = (Transliterator *)0x0;
        goto LAB_0028a1c3;
      }
      goto LAB_0028a0f5;
    }
    pTVar3 = (Transliterator *)0x0;
  }
  else {
LAB_0028a0f5:
    m_1.fMutex = (UMutex *)0x0;
    umtx_lock_63((UMutex *)0x0);
    pTVar3 = (Transliterator *)uhash_iget_63(this->cache,source);
    if (pTVar3 == (Transliterator *)0x0) {
      uhash_iput_63(this->cache,source,pTVar1,&ec);
      pTVar3 = pTVar1;
      pTVar1 = (Transliterator *)0x0;
    }
    Mutex::~Mutex(&m_1);
    if (pTVar1 == (Transliterator *)0x0) goto LAB_0028a1c3;
  }
  (*(pTVar1->super_UObject)._vptr_UObject[1])(pTVar1);
LAB_0028a1c3:
  icu_63::UnicodeString::~UnicodeString(&id);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&m);
  return pTVar3;
}

Assistant:

Transliterator* AnyTransliterator::getTransliterator(UScriptCode source) const {

    if (source == targetScript || source == USCRIPT_INVALID_CODE) {
        return NULL;
    }

    Transliterator* t = NULL;
    {
        Mutex m(NULL);
        t = (Transliterator*) uhash_iget(cache, (int32_t) source);
    }
    if (t == NULL) {
        UErrorCode ec = U_ZERO_ERROR;
        UnicodeString sourceName(uscript_getShortName(source), -1, US_INV);
        UnicodeString id(sourceName);
        id.append(TARGET_SEP).append(target);

        t = Transliterator::createInstance(id, UTRANS_FORWARD, ec);
        if (U_FAILURE(ec) || t == NULL) {
            delete t;

            // Try to pivot around Latin, our most common script
            id = sourceName;
            id.append(LATIN_PIVOT, -1).append(target);
            t = Transliterator::createInstance(id, UTRANS_FORWARD, ec);
            if (U_FAILURE(ec) || t == NULL) {
                delete t;
                t = NULL;
            }
        }

        if (t != NULL) {
            Transliterator *rt = NULL;
            {
                Mutex m(NULL);
                rt = static_cast<Transliterator *> (uhash_iget(cache, (int32_t) source));
                if (rt == NULL) {
                    // Common case, no race to cache this new transliterator.
                    uhash_iput(cache, (int32_t) source, t, &ec);
                } else {
                    // Race case, some other thread beat us to caching this transliterator.
                    Transliterator *temp = rt;
                    rt = t;    // Our newly created transliterator that lost the race & now needs deleting.
                    t  = temp; // The transliterator from the cache that we will return.
                }
            }
            delete rt;    // will be non-null only in case of races.
        }
    }
    return t;
}